

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O0

void idx2::DecompressBufZstd(buffer *Input,bitstream *Output)

{
  long lVar1;
  unsigned_long_long dstCapacity;
  size_t sVar2;
  size_t Result;
  unsigned_long_long OutputSize;
  bitstream *Output_local;
  buffer *Input_local;
  long local_88;
  i64 NewCapacity;
  i64 OriginalCapacity;
  undefined1 local_50 [8];
  buffer NewBuf;
  
  dstCapacity = ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  lVar1 = (Output->Stream).Bytes;
  for (local_88 = lVar1;
      local_88 <=
      (long)(Output->BitPtr +
            (dstCapacity -
            (long)(Output->BitPtr + ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data)
                  )) + ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data) + 8);
      local_88 = (local_88 * 3) / 2 + 8) {
  }
  if ((lVar1 < local_88) &&
     (NewBuf.Alloc = (allocator *)(local_88 + 8), (Output->Stream).Bytes < (long)NewBuf.Alloc)) {
    NewBuf.Bytes = (i64)Mallocator();
    local_50 = (undefined1  [8])0x0;
    NewBuf.Data = (byte *)0x0;
    AllocBuf((buffer *)local_50,(i64)NewBuf.Alloc,(Output->Stream).Alloc);
    MemCopy(&Output->Stream,(buffer *)local_50,
            (u64)(Output->BitPtr + ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data))
           );
    Output->BitPtr = (byte *)((long)local_50 + ((long)Output->BitPtr - (long)(Output->Stream).Data))
    ;
    DeallocBuf(&Output->Stream);
    (Output->Stream).Data = (byte *)local_50;
    (Output->Stream).Bytes = (i64)NewBuf.Data;
    (Output->Stream).Alloc = (allocator *)NewBuf.Bytes;
  }
  sVar2 = ZSTD_decompress((Output->Stream).Data,dstCapacity,Input->Data,Input->Bytes);
  if (sVar2 == dstCapacity) {
    return;
  }
  fprintf(_stderr,"Zstd decompression failed\n");
  exit(1);
}

Assistant:

void
DecompressBufZstd(const buffer& Input, bitstream* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  GrowToAccomodate(Output, OutputSize - Size(*Output));
  size_t const Result = ZSTD_decompress(Output->Stream.Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}